

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20240722::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__6,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  undefined4 *puVar1;
  long local_88;
  char *local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 local_60;
  long local_50;
  char *local_48;
  char local_40 [32];
  
  local_88 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                       (*(int *)(**(long **)this + 4),local_40);
  local_88 = local_88 - (long)local_40;
  puVar1 = *(undefined4 **)(this + 8);
  local_78 = *puVar1;
  uStack_74 = puVar1[1];
  uStack_70 = puVar1[2];
  uStack_6c = puVar1[3];
  local_60 = *(undefined8 *)(*(long *)(**(long **)(this + 0x10) + 8) + 0x20);
  local_68 = *(undefined8 *)(*(long *)(**(long **)(this + 0x10) + 8) + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_80 = local_40;
  local_50 = local_88;
  local_48 = local_40;
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
            (__return_storage_ptr__,0x44,
             "Extension number $0 has already been used in \"$1\" by extension \"$2\".",&local_88,3)
  ;
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}